

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::AsymEncryptInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Session *this_00;
  HandleManager *this_01;
  long *plVar4;
  ulong uVar5;
  CK_STATE sessionState;
  long lVar6;
  CK_RV CVar7;
  CryptoFactory *pCVar8;
  undefined4 extraout_var;
  long *in_RDX;
  SoftHSM *in_RDI;
  PublicKey *publicKey;
  AsymmetricAlgorithm *asymCrypto;
  bool isRSA;
  Type mechanism;
  CK_KEY_TYPE keyType;
  CK_RV rv;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *key;
  Token *token;
  Session *session;
  OSObject *in_stack_000000b0;
  Token *in_stack_000000b8;
  RSAPublicKey *in_stack_000000c0;
  SoftHSM *in_stack_000000c8;
  Session *in_stack_ffffffffffffff78;
  Session *this_02;
  Type local_5c;
  CK_OBJECT_HANDLE in_stack_ffffffffffffffc0;
  HandleManager *in_stack_ffffffffffffffc8;
  CK_RV local_8;
  
  if ((in_RDI->isInitialised & 1U) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == (long *)0x0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar3 = Session::getOpType(this_00);
      if (iVar3 == 0) {
        this_01 = (HandleManager *)Session::getToken(this_00);
        if (this_01 == (HandleManager *)0x0) {
          local_8 = 5;
        }
        else {
          plVar4 = (long *)HandleManager::getObject(this_01,in_stack_ffffffffffffffc0);
          if ((plVar4 == (long *)0x0) || (uVar5 = (**(code **)(*plVar4 + 0x50))(), (uVar5 & 1) == 0)
             ) {
            local_8 = 0x82;
          }
          else {
            bVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,1,0);
            bVar2 = (**(code **)(*plVar4 + 0x20))(plVar4,2,1);
            sessionState = Session::getState(in_stack_ffffffffffffff78);
            local_8 = haveRead(sessionState,bVar1 & 1,bVar2 & 1);
            if (local_8 == 0) {
              uVar5 = (**(code **)(*plVar4 + 0x20))(plVar4,0x104,0);
              if ((uVar5 & 1) == 0) {
                local_8 = 0x68;
              }
              else {
                lVar6 = (**(code **)(*plVar4 + 0x28))(plVar4,0x100,0x80000000);
                this_02 = (Session *)*in_RDX;
                if (this_02 == (Session *)0x1) {
                  if (lVar6 != 0) {
                    return 99;
                  }
                  local_5c = RSA_PKCS;
                }
                else if (this_02 == (Session *)0x3) {
                  if (lVar6 != 0) {
                    return 99;
                  }
                  local_5c = RSA;
                }
                else {
                  if (this_02 != (Session *)0x9) {
                    return 0x70;
                  }
                  if (lVar6 != 0) {
                    return 99;
                  }
                  CVar7 = MechParamCheckRSAPKCSOAEP(in_RDI,(CK_MECHANISM_PTR)0x9);
                  if (CVar7 != 0) {
                    return CVar7;
                  }
                  local_5c = RSA_PKCS_OAEP;
                }
                pCVar8 = CryptoFactory::i();
                iVar3 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,1);
                plVar4 = (long *)CONCAT44(extraout_var,iVar3);
                if (plVar4 == (long *)0x0) {
                  local_8 = 0x70;
                }
                else {
                  lVar6 = (**(code **)(*plVar4 + 0xa8))();
                  if (lVar6 == 0) {
                    pCVar8 = CryptoFactory::i();
                    (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,plVar4);
                    local_8 = 2;
                  }
                  else {
                    CVar7 = getRSAPublicKey(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                                            in_stack_000000b0);
                    if (CVar7 == 0) {
                      Session::setOpType(this_00,2);
                      Session::setAsymmetricCryptoOp
                                (this_02,(AsymmetricAlgorithm *)in_stack_ffffffffffffff78);
                      Session::setMechanism(this_00,local_5c);
                      Session::setAllowMultiPartOp(this_00,false);
                      Session::setAllowSinglePartOp(this_00,true);
                      Session::setPublicKey(this_02,(PublicKey *)in_stack_ffffffffffffff78);
                      local_8 = 0;
                    }
                    else {
                      (**(code **)(*plVar4 + 0xd0))(plVar4,lVar6);
                      pCVar8 = CryptoFactory::i();
                      (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,plVar4);
                      local_8 = 5;
                    }
                  }
                }
              }
            }
            else if (local_8 == 0x101) {
              softHSMLog(6,"AsymEncryptInit",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x97d,"User is not authorized");
            }
          }
        }
      }
      else {
        local_8 = 0x90;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::AsymEncryptInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for encryption
	if (!key->getBooleanValue(CKA_ENCRYPT, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Get key info
	CK_KEY_TYPE keyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism;
	bool isRSA = false;
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			if (keyType != CKK_RSA)
				return CKR_KEY_TYPE_INCONSISTENT;
			mechanism = AsymMech::RSA_PKCS;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			if (keyType != CKK_RSA)
				return CKR_KEY_TYPE_INCONSISTENT;
			mechanism = AsymMech::RSA;
			isRSA = true;
			break;
		case CKM_RSA_PKCS_OAEP:
			if (keyType != CKK_RSA)
				return CKR_KEY_TYPE_INCONSISTENT;
			rv = MechParamCheckRSAPKCSOAEP(pMechanism);
			if (rv != CKR_OK)
				return rv;

			mechanism = AsymMech::RSA_PKCS_OAEP;
			isRSA = true;
			break;
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PublicKey* publicKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPublicKey((RSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else
	{
		return CKR_MECHANISM_INVALID;
        }

	session->setOpType(SESSION_OP_ENCRYPT);
	session->setAsymmetricCryptoOp(asymCrypto);
	session->setMechanism(mechanism);
	session->setAllowMultiPartOp(false);
	session->setAllowSinglePartOp(true);
	session->setPublicKey(publicKey);

	return CKR_OK;
}